

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

uint64_t SHUFF_INPUT_ULONG(bit_io_t *bio,int64_t len)

{
  long lVar1;
  ulong in_RSI;
  bit_io_t *in_RDI;
  uint64_t n;
  ulong local_20;
  ulong local_8;
  
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else {
    if (in_RDI->buff_btg == 0x40) {
      local_20 = *in_RDI->in_u64 >> (0x40U - (char)in_RSI & 0x3f);
    }
    else {
      local_20 = (*in_RDI->in_u64 << (0x40U - (char)in_RDI->buff_btg & 0x3f)) >>
                 (0x40U - (char)in_RSI & 0x3f);
    }
    if (in_RSI < in_RDI->buff_btg) {
      in_RDI->buff_btg = in_RDI->buff_btg - in_RSI;
    }
    else {
      lVar1 = in_RSI - in_RDI->buff_btg;
      SHUFF_INPUT_NEXT(in_RDI);
      if (0 < lVar1) {
        local_20 = *in_RDI->in_u64 >> (0x40U - (char)lVar1 & 0x3f) | local_20;
        in_RDI->buff_btg = in_RDI->buff_btg - lVar1;
      }
    }
    if (in_RDI->buff_btg == 0) {
      SHUFF_INPUT_NEXT(in_RDI);
    }
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

inline uint64_t SHUFF_INPUT_ULONG(bit_io_t* bio, int64_t len)
{
    if (len == 0)
        return 0;

    uint64_t n;

    if (bio->buff_btg == SHUFF_BUFF_BITS)
        n = (*bio->in_u64) >> (SHUFF_BUFF_BITS - len);
    else
        n = ((*bio->in_u64) << (SHUFF_BUFF_BITS - bio->buff_btg))
            >> (SHUFF_BUFF_BITS - len);

    if (len < bio->buff_btg)
        bio->buff_btg -= len;
    else {
        len -= bio->buff_btg;
        SHUFF_INPUT_NEXT(bio);
        if (len > 0) {
            n |= (*bio->in_u64) >> (SHUFF_BUFF_BITS - len);
            bio->buff_btg -= len;
        }
    }

    if (bio->buff_btg == 0)
        SHUFF_INPUT_NEXT(bio);

    return n;
}